

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFiltersExport.cpp
# Opt level: O2

HelicsFilter helicsFederateRegisterCloningFilter(HelicsFederate fed,char *name,HelicsError *err)

{
  undefined1 auVar1 [16];
  CloningFilter *pCVar2;
  HelicsFilter pvVar3;
  string_view name_00;
  allocator<char> local_89;
  __single_object filt;
  unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_> local_80;
  shared_ptr<helics::Federate> fedObj;
  char *local_68;
  size_t local_60;
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38 [16];
  
  getFedSharedPtr(&fedObj,(HelicsError *)fed);
  if (fedObj.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    pvVar3 = (HelicsFilter)0x0;
  }
  else {
    std::make_unique<helics::FilterObject>();
    local_40 = 0;
    local_38[0] = 0;
    local_48 = local_38;
    if (name == (char *)0x0) {
      std::__cxx11::string::string((string *)&local_68,&gHelicsEmptyStr_abi_cxx11_);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,name,&local_89);
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_38;
    name_00._M_str = local_68;
    name_00._M_len = local_60;
    pCVar2 = helics::make_cloning_filter
                       (CLONE,fedObj.
                              super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr,(string_view)(auVar1 << 0x40),name_00);
    *(CloningFilter **)
     ((long)filt._M_t.
            super___uniq_ptr_impl<helics::FilterObject,_std::default_delete<helics::FilterObject>_>.
            _M_t.
            super__Tuple_impl<0UL,_helics::FilterObject_*,_std::default_delete<helics::FilterObject>_>
            .super__Head_base<0UL,_helics::FilterObject_*,_false>._M_head_impl + 8) = pCVar2;
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
    std::__shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)filt._M_t.
                      super___uniq_ptr_impl<helics::FilterObject,_std::default_delete<helics::FilterObject>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_helics::FilterObject_*,_std::default_delete<helics::FilterObject>_>
                      .super__Head_base<0UL,_helics::FilterObject_*,_false>._M_head_impl + 0x18),
               &fedObj.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>);
    *(undefined1 *)
     filt._M_t.
     super___uniq_ptr_impl<helics::FilterObject,_std::default_delete<helics::FilterObject>_>._M_t.
     super__Tuple_impl<0UL,_helics::FilterObject_*,_std::default_delete<helics::FilterObject>_>.
     super__Head_base<0UL,_helics::FilterObject_*,_false>._M_head_impl = 1;
    local_80._M_t.
    super___uniq_ptr_impl<helics::FilterObject,_std::default_delete<helics::FilterObject>_>._M_t.
    super__Tuple_impl<0UL,_helics::FilterObject_*,_std::default_delete<helics::FilterObject>_>.
    super__Head_base<0UL,_helics::FilterObject_*,_false>._M_head_impl =
         filt._M_t.
         super___uniq_ptr_impl<helics::FilterObject,_std::default_delete<helics::FilterObject>_>.
         _M_t.
         super__Tuple_impl<0UL,_helics::FilterObject_*,_std::default_delete<helics::FilterObject>_>.
         super__Head_base<0UL,_helics::FilterObject_*,_false>._M_head_impl;
    filt._M_t.
    super___uniq_ptr_impl<helics::FilterObject,_std::default_delete<helics::FilterObject>_>._M_t.
    super__Tuple_impl<0UL,_helics::FilterObject_*,_std::default_delete<helics::FilterObject>_>.
    super__Head_base<0UL,_helics::FilterObject_*,_false>._M_head_impl =
         (__uniq_ptr_data<helics::FilterObject,_std::default_delete<helics::FilterObject>,_true,_true>
          )(__uniq_ptr_impl<helics::FilterObject,_std::default_delete<helics::FilterObject>_>)0x0;
    pvVar3 = anon_unknown.dwarf_a089a::federateAddFilter(fed,&local_80);
    std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>::~unique_ptr
              (&local_80);
    std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>::~unique_ptr
              (&filt);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&fedObj.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return pvVar3;
}

Assistant:

HelicsFilter helicsFederateRegisterCloningFilter(HelicsFederate fed, const char* name, HelicsError* err)
{
    auto fedObj = getFedSharedPtr(fed, err);
    if (!fedObj) {
        return nullptr;
    }

    try {
        auto filt = std::make_unique<helics::FilterObject>();
        filt->filtPtr = &helics::make_cloning_filter(helics::FilterTypes::CLONE, fedObj.get(), std::string{}, AS_STRING(name));
        filt->fedptr = std::move(fedObj);
        filt->cloning = true;
        return federateAddFilter(fed, std::move(filt));
    }
    catch (...) {
        helicsErrorHandler(err);
    }
    return nullptr;
}